

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::EnumValBuilder::AssignEnumeratorValue(EnumValBuilder *this,string *value)

{
  string *msg;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  uint64_t u64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (value->field_2)._M_local_buf[8] = '\x01';
  if (*(int *)(value->_M_string_length + 0xd0) == 10) {
    bVar1 = StringToNumber<unsigned_long>((in_RDX->_M_dataplus)._M_p,(uint64_t *)&local_60);
  }
  else {
    bVar1 = StringToNumber<long>((in_RDX->_M_dataplus)._M_p,(int64_t *)&local_60);
  }
  *(pointer *)((value->field_2)._M_allocated_capacity + 0xa0) = local_60._M_dataplus._M_p;
  if (bVar1 == false) {
    msg = (string *)(value->_M_dataplus)._M_p;
    std::operator+(&local_40,"enum value does not fit, \"",in_RDX);
    std::operator+(&local_60,&local_40,"\"");
    Parser::Error((Parser *)this,msg);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    *(undefined2 *)&this->parser = 0;
  }
  return SUB82(this,0);
}

Assistant:

FLATBUFFERS_CHECKED_ERROR AssignEnumeratorValue(const std::string &value) {
    user_value = true;
    auto fit = false;
    if (enum_def.IsUInt64()) {
      uint64_t u64;
      fit = StringToNumber(value.c_str(), &u64);
      temp->value = static_cast<int64_t>(u64);  // well-defined since C++20.
    } else {
      int64_t i64;
      fit = StringToNumber(value.c_str(), &i64);
      temp->value = i64;
    }
    if (!fit) return parser.Error("enum value does not fit, \"" + value + "\"");
    return NoError();
  }